

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseExprList(WastParser *this,ExprList *exprs)

{
  Expr *pEVar1;
  undefined1 auVar2 [8];
  bool bVar3;
  Result RVar4;
  Enum EVar5;
  int __flags;
  undefined1 auStack_58 [8];
  ExprList new_exprs;
  
  auStack_58 = (undefined1  [8])0x0;
  new_exprs.first_ = (Expr *)0x0;
  new_exprs.last_ = (Expr *)0x0;
  do {
    while( true ) {
      bVar3 = PeekMatchExpr(this);
      if (!bVar3) {
        EVar5 = Ok;
        auVar2 = auStack_58;
        goto joined_r0x00f75523;
      }
      RVar4 = ParseExpr(this,(ExprList *)auStack_58);
      if (RVar4.enum_ != Ok) break;
      __flags = (int)(ExprList *)auStack_58;
      intrusive_list<wabt::Expr>::splice
                (exprs,(int)exprs,(__off64_t *)0x0,__flags,(__off64_t *)auStack_58,
                 (size_t)auStack_58,__flags);
    }
    RVar4 = Synchronize(this,anon_unknown_1::IsExpr);
  } while (RVar4.enum_ != Error);
  EVar5 = Error;
  auVar2 = auStack_58;
joined_r0x00f75523:
  while (auVar2 != (undefined1  [8])0x0) {
    pEVar1 = (((Expr *)auVar2)->super_intrusive_list_base<wabt::Expr>).next_;
    (*((Expr *)auVar2)->_vptr_Expr[1])();
    auVar2 = (undefined1  [8])pEVar1;
  }
  return (Result)EVar5;
}

Assistant:

Result WastParser::ParseExprList(ExprList* exprs) {
  WABT_TRACE(ParseExprList);
  ExprList new_exprs;
  while (PeekMatchExpr()) {
    if (Succeeded(ParseExpr(&new_exprs))) {
      exprs->splice(exprs->end(), new_exprs);
    } else {
      CHECK_RESULT(Synchronize(IsExpr));
    }
  }
  return Result::Ok;
}